

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

bool __thiscall soplex::SPxSolverBase<double>::terminate(SPxSolverBase<double> *this)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  SPxSense SVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  SPxOut *pSVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Real RVar12;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  Verbosity old_verbosity;
  Verbosity local_34;
  
  uVar2 = (this->super_SPxBasisBase<double>).iterCount;
  if (10 < (int)uVar2) {
    uVar3 = (this->thecovectors->set).thenum;
    uVar10 = 1000;
    if (1000 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    if ((int)((ulong)uVar2 % uVar10) == 0) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
        [(ulong)(this->theType != ENTER) + 0x7c])(this);
      computeFrhs(this);
      if (1 < (this->super_SPxBasisBase<double>).updateCount) {
        pSVar8 = this->spxout;
        if ((pSVar8 != (SPxOut *)0x0) && (4 < (int)pSVar8->m_verbosity)) {
          local_34 = pSVar8->m_verbosity;
          (*pSVar8->_vptr_SPxOut[2])();
          pSVar8 = this->spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar8->m_streams[pSVar8->m_verbosity],
                     " --- terminate triggers refactorization",0x27);
          cVar5 = (char)pSVar8->m_streams[pSVar8->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar8->m_streams[pSVar8->m_verbosity] + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_34);
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
      }
      SPxBasisBase<double>::coSolve
                (&this->super_SPxBasisBase<double>,&this->theCoPvec->super_VectorBase<double>,
                 this->theCoPrhs);
      SPxBasisBase<double>::solve
                (&this->super_SPxBasisBase<double>,&this->theFvec->super_VectorBase<double>,
                 this->theFrhs);
      if ((this->thePricing == FULL) && (computePvec(this), this->theType == ENTER)) {
        computeCoTest(this);
        computeTest(this);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
      if (0.0 < extraout_XMM0_Qa) {
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6e])(this);
      }
    }
  }
  bVar9 = true;
  iVar7 = 0;
  lVar11 = 0x33c;
  if ((uint)(this->super_SPxBasisBase<double>).thestatus < 3) {
    bVar6 = isTimeLimitReached(this,false);
    if (bVar6) {
      pSVar8 = this->spxout;
      iVar7 = -7;
      if ((pSVar8 != (SPxOut *)0x0) && (local_34 = pSVar8->m_verbosity, 3 < (int)local_34)) {
        (*pSVar8->_vptr_SPxOut[2])();
        pSVar8 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar8->m_streams[pSVar8->m_verbosity]," --- timelimit (",0x10);
        std::ostream::_M_insert<double>(this->maxTime);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar8->m_streams[pSVar8->m_verbosity],") reached",9);
        cVar5 = (char)pSVar8->m_streams[pSVar8->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar8->m_streams[pSVar8->m_verbosity] + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_34);
      }
    }
    else {
      dVar1 = this->objLimit;
      ::soplex::infinity::__tls_init();
      if ((dVar1 < *(double *)(in_FS_OFFSET + -8)) && (0 < this->theRep * this->theType)) {
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
        RVar12 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if (extraout_XMM0_Qa_00 < RVar12) {
          RVar12 = Tolerances::floatingPointOpttol
                             ((this->super_SPxLPBase<double>)._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
          (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
          iVar7 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                    _vptr_ClassArray[0x74])(RVar12 - extraout_XMM0_Qa_01,this);
          if (((char)iVar7 != '\0') &&
             (SVar4 = (this->super_SPxLPBase<double>).thesense,
             (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this),
             extraout_XMM0_Qa_02 * (double)SVar4 <=
             (double)(this->super_SPxLPBase<double>).thesense * this->objLimit)) {
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5f])(this);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
            RVar12 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            if (extraout_XMM0_Qa_03 < RVar12) {
              RVar12 = Tolerances::floatingPointOpttol
                                 ((this->super_SPxLPBase<double>)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
              iVar7 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                        _vptr_ClassArray[0x74])(RVar12 - extraout_XMM0_Qa_04,this);
              if (((char)iVar7 != '\0') &&
                 (SVar4 = (this->super_SPxLPBase<double>).thesense,
                 (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                   _vptr_ClassArray[0x5e])(this),
                 extraout_XMM0_Qa_05 * (double)SVar4 <=
                 (double)(this->super_SPxLPBase<double>).thesense * this->objLimit)) {
                pSVar8 = this->spxout;
                if ((pSVar8 != (SPxOut *)0x0) && (3 < (int)pSVar8->m_verbosity)) {
                  local_34 = pSVar8->m_verbosity;
                  (*pSVar8->_vptr_SPxOut[2])();
                  pSVar8 = soplex::operator<<(this->spxout," --- objective value limit (");
                  std::ostream::_M_insert<double>(this->objLimit);
                  pSVar8 = soplex::operator<<(pSVar8,") reached");
                  std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
                  (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_34);
                }
                (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                  .super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
                iVar7 = -5;
                goto LAB_001bc7a5;
              }
            }
          }
        }
      }
      iVar7 = (this->super_SPxBasisBase<double>).iterCount;
      lVar11 = 0x23c;
      bVar9 = false;
    }
  }
LAB_001bc7a5:
  *(int *)((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                  .super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar11) = iVar7;
  return bVar9;
}

Assistant:

bool SPxSolverBase<R>::terminate()
{
#ifdef ENABLE_ADDITIONAL_CHECKS

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::SINGULAR)
      testVecs();

#endif

   int redo = dim();

   if(redo < 1000)
      redo = 1000;

   if(this->iteration() > 10 && this->iteration() % redo == 0)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      VectorBase<R> cr(*theCoPrhs);
      VectorBase<R> fr(*theFrhs);
#endif

      if(type() == ENTER)
         computeEnterCoPrhs();
      else
         computeLeaveCoPrhs();

      computeFrhs();

#ifdef ENABLE_ADDITIONAL_CHECKS
      cr -= *theCoPrhs;
      fr -= *theFrhs;

      if(cr.length() > leavetol())
         SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE50 unexpected change of coPrhs "
                         << cr.length() << std::endl;)
         if(fr.length() > entertol())
            SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE51 unexpected change of   Frhs "
                            << fr.length() << std::endl;)
#endif

            if(this->updateCount > 1)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << " --- terminate triggers refactorization"
                             << std::endl;)
               factorize();
            }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      if(pricing() == FULL)
      {
         computePvec();

         if(type() == ENTER)
         {
            computeCoTest();
            computeTest();
         }
      }

      if(shift() > 0.0)
         unShift();
   }

   // check time limit and objective limit only for non-terminal bases
   if(SPxBasisBase<R>::status() >= SPxBasisBase<R>::OPTIMAL  ||
         SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR)
   {
      m_status = UNKNOWN;
      return true;
   }

   if(isTimeLimitReached())
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- timelimit (" << maxTime
                    << ") reached" << std::endl;)
      m_status = ABORT_TIME;
      return true;
   }

   // objLimit is set and we are running DUAL:
   // - objLimit is set if objLimit < R(infinity)
   // - DUAL is running if rep() * type() > 0 == DUAL (-1 == PRIMAL)
   //
   // In this case we have given a objective value limit, e.g, through a
   // MIP solver, and we want stop solving the LP if we figure out that the
   // optimal value of the current LP can not be better then this objective
   // limit. More precisely:
   // - MINIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit <= current objective value of the DUAL LP
   // - MAXIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit >= current objective value of the DUAL LP
   if(objLimit < R(infinity) && type() * rep() > 0)
   {
      // We have no bound shifts; therefore, we can trust the current
      // objective value.
      // It might be even possible to use this termination value in case of
      // bound violations (shifting) but in this case it is quite difficult
      // to determine if we already reached the limit.
      if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift()))
      {
         // SPxSense::MINIMIZE == -1, so we have sign = 1 on minimizing
         if(int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
         {
            // ensure that solution is accurate
            factorizeAndRecompute();

            // check no violations and objective limit again
            if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift())
                  && int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- objective value limit (" << objLimit
                             << ") reached" << std::endl;)
               SPxOut::debug(this, " --- objective value limit reached\n (value:{} limit:{})\n", value(),
                             objLimit);
               SPxOut::debug(this, " (spxSense:{} rep:{} type:{})\n", int(this->spxSense()), int(rep()),
                             int(type()));

               m_status = ABORT_VALUE;
               return true;
            }
         }
      }
   }

   this->lastIterCount = this->iterCount;

   return false;
}